

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

WriteNLResult *
mp::WriteNLFile<mp::NLFeeder_Easy>
          (WriteNLResult *__return_storage_ptr__,string *namebase,NLFeeder_Easy *nlf,NLUtils *utl)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  FILE *__stream;
  byte bVar5;
  undefined1 local_198 [16];
  NLFeeder_Easy *local_188;
  undefined1 local_180 [160];
  int local_e0;
  int local_dc [26];
  undefined8 local_74;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  NLW2_WriteNLResultCode NStack_60;
  undefined4 uStack_5c;
  _Alloc_hider local_58;
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  
  bVar5 = 0;
  iVar1 = (nlf->header_).super_NLInfo.super_NLInfo_C.format;
  piVar3 = &(nlf->header_).super_NLInfo.super_NLInfo_C.num_ampl_options;
  local_198._0_8_ = utl;
  if (iVar1 == 0) {
    memcpy(local_180,&nlf->header_,0xa8);
    piVar4 = local_dc + 2;
    for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
      *piVar4 = *piVar3;
      piVar3 = piVar3 + (ulong)bVar5 * -2 + 1;
      piVar4 = piVar4 + (ulong)bVar5 * -2 + 1;
    }
    local_198[8] = (nlf->nlopt_).want_nl_comments_ != 0;
    local_198._8_8_ = local_198._8_8_ & 0xffffffff;
    local_dc[1] = 0;
    iStack_6c = 0;
    iStack_68 = 0;
    iStack_64 = 0;
    NStack_60 = NLW2_WriteNL_Unset;
    uStack_5c = 0;
    local_58._M_p._0_4_ = NLW2_WriteNL_Unset;
    local_48._0_8_ = 0;
    local_48[8] = '\0';
    local_188 = nlf;
    local_50._M_p = local_48 + 8;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)local_198,
               namebase);
    if (local_50._M_p != local_48 + 8) {
      operator_delete(local_50._M_p,CONCAT71(local_48._9_7_,local_48[8]) + 1);
    }
    __stream = (FILE *)CONCAT44(uStack_5c,NStack_60);
  }
  else {
    memcpy(&local_188,&nlf->header_,0xa8);
    piVar4 = local_dc;
    for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
      *piVar4 = *piVar3;
      piVar3 = piVar3 + (ulong)bVar5 * -2 + 1;
      piVar4 = piVar4 + (ulong)bVar5 * -2 + 1;
    }
    local_74._0_4_ = 0;
    local_74._4_4_ = 0;
    iStack_6c = 0;
    iStack_68 = 0;
    iStack_64 = 0;
    NStack_60 = NLW2_WriteNL_Unset;
    local_50._M_p = (pointer)0x0;
    local_48._0_8_ = local_48._0_8_ & 0xffffffffffffff00;
    local_198._8_8_ = nlf;
    local_e0 = iVar1;
    local_58._M_p = local_48;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)local_198,
               namebase);
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p,local_48._0_8_ + 1);
    }
    __stream = (FILE *)CONCAT44(iStack_64,iStack_68);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

inline WriteNLResult WriteNLFile(
    const std::string& namebase,
    NLFeeder& nlf, NLUtils& utl) {
  auto h = nlf.Header();
  if (NLHeader::TEXT == h.format) {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::TextFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  } else {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::BinaryFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  }
}